

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereSplit(WhereClause *pWC,Expr *pExpr,int op)

{
  int op_local;
  Expr *pExpr_local;
  WhereClause *pWC_local;
  
  pWC->op = (u8)op;
  if (pExpr != (Expr *)0x0) {
    if ((uint)pExpr->op == op) {
      whereSplit(pWC,pExpr->pLeft,op);
      whereSplit(pWC,pExpr->pRight,op);
    }
    else {
      whereClauseInsert(pWC,pExpr,'\0');
    }
  }
  return;
}

Assistant:

static void whereSplit(WhereClause *pWC, Expr *pExpr, int op){
  pWC->op = (u8)op;
  if( pExpr==0 ) return;
  if( pExpr->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    whereSplit(pWC, pExpr->pLeft, op);
    whereSplit(pWC, pExpr->pRight, op);
  }
}